

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void execute_stored_code(vector<unsigned_char,_std::allocator<unsigned_char>_> *code)

{
  int iVar1;
  size_type sVar2;
  int *piVar3;
  error_category *peVar4;
  system_error *psVar5;
  const_iterator __first;
  ostream *poVar6;
  char *pcVar7;
  error_code __ec;
  error_code __ec_00;
  undefined1 auStack_68 [8];
  error_code ec_1;
  undefined1 auStack_28 [8];
  error_code ec;
  void *memory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *code_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(code);
  ec._M_cat = (error_category *)mmap((void *)0x0,sVar2,2,0x22,-1,0);
  if (ec._M_cat == (error_category *)0xffffffffffffffff) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    peVar4 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)auStack_28,iVar1,peVar4);
    psVar5 = (system_error *)__cxa_allocate_exception(0x20);
    __ec._0_8_ = (ulong)auStack_28 & 0xffffffff;
    __ec._M_cat = (error_category *)ec._0_8_;
    std::system_error::system_error(psVar5,__ec,"Failed to allocate memory for the code");
    __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin(code);
  ec_1._M_cat = (error_category *)
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend(code);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )ec_1._M_cat,(uchar *)ec._M_cat);
  peVar4 = ec._M_cat;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(code);
  iVar1 = mprotect(peVar4,sVar2,5);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    peVar4 = (error_category *)std::_V2::system_category();
    std::error_code::error_code((error_code *)auStack_68,iVar1,peVar4);
    psVar5 = (system_error *)__cxa_allocate_exception(0x20);
    __ec_00._0_8_ = (ulong)auStack_68 & 0xffffffff;
    __ec_00._M_cat = (error_category *)ec_1._0_8_;
    std::system_error::system_error(psVar5,__ec_00,"Failed to change memory permissions");
    __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  (*(code *)ec._M_cat)();
  peVar4 = ec._M_cat;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(code);
  iVar1 = munmap(peVar4,sVar2);
  if (iVar1 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Warning: failed to deallocate code memory: ");
    piVar3 = __errno_location();
    pcVar7 = strerror(*piVar3);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void execute_stored_code(const std::vector<byte>& code)
{
    // Allocate
    void* memory = mmap(nullptr, code.size(), PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (memory == MAP_FAILED) {
        std::error_code ec(errno, std::system_category());
        throw std::system_error(ec, "Failed to allocate memory for the code");
    }

    // Copy
    std::copy(code.cbegin(), code.cend(), static_cast<byte*>(memory));

    // Protect (r-x)
    if (mprotect(memory, code.size(), PROT_READ | PROT_EXEC) != 0) {
        std::error_code ec(errno, std::system_category());
        throw std::system_error(ec, "Failed to change memory permissions");
    }

    // Execute
    (reinterpret_cast<void(*)(void)>(memory))();

    // Deallocate
    if (munmap(memory, code.size()) != 0) {
        std::cerr << "Warning: failed to deallocate code memory: "
                  << strerror(errno) << std::endl;
    }
}